

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O0

energy_t __thiscall
W_final::E_ext_Stem(W_final *this,energy_t *vij,energy_t *vi1j,energy_t *vij1,energy_t *vi1j1,
                   short *S,paramT *params,cand_pos_t i,cand_pos_t j,cand_pos_t n,
                   vector<Node,_std::allocator<Node>_> *tree)

{
  short sVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  reference pvVar5;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_R8;
  long in_R9;
  vrna_param_t *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  vector<Node,_std::allocator<Node>_> *in_stack_00000028;
  base_type sj1_2;
  base_type si1_2;
  base_type sj1_1;
  base_type si1_1;
  base_type sj1;
  base_type si1;
  pair_type tt;
  energy_t en;
  energy_t e;
  energy_t local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_38;
  int local_34;
  
  local_34 = 10000000;
  sVar4 = (short)pair[*(short *)(in_R9 + (long)in_stack_00000010 * 2)]
                 [*(short *)(in_R9 + (long)in_stack_00000018 * 2)];
  pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                     (in_stack_00000028,(long)in_stack_00000010);
  if ((((pvVar5->pair < -1) &&
       (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (in_stack_00000028,(long)in_stack_00000018), pvVar5->pair < -1)) ||
      ((pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (in_stack_00000028,(long)in_stack_00000010),
       pvVar5->pair == in_stack_00000018 &&
       (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (in_stack_00000028,(long)in_stack_00000018),
       pvVar5->pair == in_stack_00000010)))) && (iVar3 = *in_RSI, iVar3 != 10000000)) {
    if ((in_stack_00000008->model_details).dangles == 2) {
      if (in_stack_00000010 < 2) {
        sVar1 = -1;
      }
      else {
        sVar1 = *(short *)(in_R9 + (long)(in_stack_00000010 + -1) * 2);
      }
      if (in_stack_00000018 < in_stack_00000020) {
        sVar2 = *(short *)(in_R9 + (long)(in_stack_00000018 + 1) * 2);
      }
      else {
        sVar2 = -1;
      }
      local_38 = vrna_E_ext_stem((int)sVar4,(int)sVar1,(int)sVar2,in_stack_00000008);
    }
    else {
      local_38 = vrna_E_ext_stem((int)sVar4,-1,-1,in_stack_00000008);
    }
    local_38 = local_38 + iVar3;
    if (local_38 < 0x989681) {
      local_54 = local_38;
    }
    else {
      local_54 = 10000000;
    }
    local_34 = local_54;
  }
  if ((in_stack_00000008->model_details).dangles == 1) {
    iVar3 = pair[*(short *)(in_R9 + (long)(in_stack_00000010 + 1) * 2)]
            [*(short *)(in_R9 + (long)in_stack_00000018 * 2)];
    pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       (in_stack_00000028,(long)(in_stack_00000010 + 1));
    if ((((pvVar5->pair < -1) &&
         (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (in_stack_00000028,(long)in_stack_00000018), pvVar5->pair < -1)) ||
        (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                            (in_stack_00000028,(long)(in_stack_00000010 + 1)),
        pvVar5->pair == in_stack_00000018)) &&
       (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (in_stack_00000028,(long)in_stack_00000010), pvVar5->pair < 0)) {
      if ((in_stack_00000018 - in_stack_00000010) + -1 < 4) {
        local_58 = 10000000;
      }
      else {
        local_58 = *in_RDX;
      }
      local_38 = local_58;
      if (local_58 != 10000000) {
        local_38 = vrna_E_ext_stem((int)(short)iVar3,
                                   (int)*(short *)(in_R9 + (long)in_stack_00000010 * 2),-1,
                                   in_stack_00000008);
        local_38 = local_38 + local_58;
      }
      if (local_34 < local_38) {
        local_5c = local_34;
      }
      else {
        local_5c = local_38;
      }
      local_34 = local_5c;
    }
    iVar3 = pair[*(short *)(in_R9 + (long)in_stack_00000010 * 2)]
            [*(short *)(in_R9 + (long)(in_stack_00000018 + -1) * 2)];
    pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       (in_stack_00000028,(long)in_stack_00000010);
    if ((((pvVar5->pair < -1) &&
         (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (in_stack_00000028,(long)(in_stack_00000018 + -1)), pvVar5->pair < -1))
        || (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                               (in_stack_00000028,(long)in_stack_00000010),
           pvVar5->pair == in_stack_00000018 + -1)) &&
       (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                           (in_stack_00000028,(long)in_stack_00000018), pvVar5->pair < 0)) {
      if ((in_stack_00000018 + -1) - in_stack_00000010 < 4) {
        local_60 = 10000000;
      }
      else {
        local_60 = *in_RCX;
      }
      local_38 = local_60;
      if (local_60 != 10000000) {
        local_38 = vrna_E_ext_stem((int)(short)iVar3,-1,
                                   (int)*(short *)(in_R9 + (long)in_stack_00000018 * 2),
                                   in_stack_00000008);
        local_38 = local_38 + local_60;
      }
      if (local_34 < local_38) {
        local_64 = local_34;
      }
      else {
        local_64 = local_38;
      }
      local_34 = local_64;
    }
    iVar3 = pair[*(short *)(in_R9 + (long)(in_stack_00000010 + 1) * 2)]
            [*(short *)(in_R9 + (long)(in_stack_00000018 + -1) * 2)];
    pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                       (in_stack_00000028,(long)(in_stack_00000010 + 1));
    if ((((pvVar5->pair < -1) &&
         (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                             (in_stack_00000028,(long)(in_stack_00000018 + -1)), pvVar5->pair < -1))
        || (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                               (in_stack_00000028,(long)(in_stack_00000010 + 1)),
           pvVar5->pair == in_stack_00000018 + -1)) &&
       ((pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                            (in_stack_00000028,(long)in_stack_00000010), pvVar5->pair < 0 &&
        (pvVar5 = std::vector<Node,_std::allocator<Node>_>::operator[]
                            (in_stack_00000028,(long)in_stack_00000018), pvVar5->pair < 0)))) {
      if ((in_stack_00000018 - in_stack_00000010) + -2 < 4) {
        local_68 = 10000000;
      }
      else {
        local_68 = *in_R8;
      }
      local_38 = local_68;
      if (local_68 != 10000000) {
        local_38 = vrna_E_ext_stem((int)(short)iVar3,
                                   (int)*(short *)(in_R9 + (long)in_stack_00000010 * 2),
                                   (int)*(short *)(in_R9 + (long)in_stack_00000018 * 2),
                                   in_stack_00000008);
        local_38 = local_38 + local_68;
      }
      if (local_34 < local_38) {
        local_6c = local_34;
      }
      else {
        local_6c = local_38;
      }
      local_34 = local_6c;
    }
  }
  return local_34;
}

Assistant:

energy_t W_final::E_ext_Stem(const energy_t& vij,const energy_t& vi1j,const energy_t& vij1,const energy_t& vi1j1,const short* S, paramT* params, const cand_pos_t i,const cand_pos_t j, cand_pos_t n, std::vector<Node> &tree){

	energy_t e = INF,en = INF;
  	pair_type tt  = pair[S[i]][S[j]];
	
    if ((tree[i].pair <-1 && tree[j].pair <-1) || (tree[i].pair == j && tree[j].pair == i)) {
				en = vij; // i j

				if (en != INF) {
					if (params->model_details.dangles == 2){
						base_type si1 = i>1 ? S[i-1] : -1;
                		base_type sj1 = j<n ? S[j+1] : -1;
                        en += vrna_E_ext_stem(tt, si1, sj1, params);
					}
                    else{
                        en += vrna_E_ext_stem(tt, -1, -1, params);
					}

                    e = MIN2(e, en);
					
				}

	}

	if(params->model_details.dangles  == 1){
        tt  = pair[S[i+1]][S[j]];
        if (((tree[i+1].pair <-1 && tree[j].pair <-1) || (tree[i+1].pair == j)) && tree[i].pair<0) {
            en = (j-i-1>TURN) ? vi1j : INF; //i+1 j

            if (en != INF) {

                base_type si1 = S[i];
                en += vrna_E_ext_stem(tt, si1, -1, params);
            }

            e = MIN2(e,en);

        }
        tt  = pair[S[i]][S[j-1]];
        if (((tree[i].pair <-1 && tree[j-1].pair <-1) || (tree[i].pair == j-1)) && tree[j].pair<0) {
            en = (j-1-i>TURN) ? vij1 : INF; // i j-1
            if (en != INF) {

                base_type sj1 = S[j];

                en += vrna_E_ext_stem(tt, -1, sj1, params);
            }
            e = MIN2(e,en);

        }
        tt  = pair[S[i+1]][S[j-1]];
        if (((tree[i+1].pair <-1 && tree[j-1].pair <-1) || (tree[i+1].pair == j-1)) && tree[i].pair < 0 && tree[j].pair<0) {
            en = (j-1-i-1>TURN) ? vi1j1 : INF; // i+1 j-1

            if (en != INF) {

                base_type si1 = S[i];
                base_type sj1 = S[j];

                en += vrna_E_ext_stem(tt, si1, sj1, params);
            }
            e = MIN2(e,en);
        }
	}
	return e;
}